

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pipeline_event.cpp
# Opt level: O3

void __thiscall
duckdb::BasePipelineEvent::BasePipelineEvent
          (BasePipelineEvent *this,shared_ptr<duckdb::Pipeline,_true> *pipeline_p)

{
  Executor *pEVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Pipeline *pPVar4;
  
  pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator->(pipeline_p);
  pEVar1 = pPVar4->executor;
  (this->super_Event).super_enable_shared_from_this<duckdb::Event>.__weak_this_.internal.
  super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Event).super_enable_shared_from_this<duckdb::Event>.__weak_this_.internal.
  super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Event).executor = pEVar1;
  (this->super_Event).parents_raw.
  super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Event).parents_raw.
  super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Event).parents.
  super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  .
  super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Event).parents_raw.
  super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Event).parents.
  super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  .
  super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Event).parents.
  super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  .
  super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Event).finished_dependencies.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Event).total_dependencies = 0;
  (this->super_Event).finished_tasks.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Event).total_tasks.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Event).finished._M_base._M_i = false;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR__BasePipelineEvent_01979488;
  (this->pipeline).internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pipeline).internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  (this->pipeline).internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

BasePipelineEvent::BasePipelineEvent(shared_ptr<Pipeline> pipeline_p)
    : Event(pipeline_p->executor), pipeline(std::move(pipeline_p)) {
}